

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericProperty.h
# Opt level: O0

bool SetGenericProperty<float>
               (map<unsigned_int,_float,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
                *list,char *szName,float *value)

{
  float fVar1;
  bool bVar2;
  reference ppVar3;
  pair<unsigned_int,_float> local_48;
  _Self local_40;
  _Self local_38;
  iterator it;
  uint32_t hash;
  float *value_local;
  char *szName_local;
  map<unsigned_int,_float,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
  *list_local;
  
  if (szName != (char *)0x0) {
    it._M_node._4_4_ = SuperFastHash(szName,0,0);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_float,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
         ::find(list,(key_type *)((long)&it._M_node + 4));
    local_40._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_float,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
         ::end(list);
    bVar2 = std::operator==(&local_38,&local_40);
    if (bVar2) {
      std::pair<unsigned_int,_float>::pair<unsigned_int,_float,_true>
                (&local_48,(uint *)((long)&it._M_node + 4),value);
      std::
      map<unsigned_int,float,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,float>>>
      ::insert<std::pair<unsigned_int,float>>
                ((map<unsigned_int,float,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,float>>>
                  *)list,&local_48);
    }
    else {
      fVar1 = *value;
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_float>_>::operator*(&local_38);
      ppVar3->second = fVar1;
    }
    list_local._7_1_ = !bVar2;
    return list_local._7_1_;
  }
  __assert_fail("nullptr != szName",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/include/assimp/GenericProperty.h"
                ,0x3e,
                "bool SetGenericProperty(std::map<unsigned int, T> &, const char *, const T &) [T = float]"
               );
}

Assistant:

inline
bool SetGenericProperty(std::map< unsigned int, T >& list,
        const char* szName, const T& value) {
    ai_assert(nullptr != szName);
    const uint32_t hash = SuperFastHash(szName);

    typename std::map<unsigned int, T>::iterator it = list.find(hash);
    if (it == list.end())   {
        list.insert(std::pair<unsigned int, T>( hash, value ));
        return false;
    }
    (*it).second = value;

    return true;
}